

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

string * __thiscall
tinyformat::format<Identifier,Identifier,unsigned_long>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,Identifier *args,
          Identifier *args_1,unsigned_long *args_2)

{
  ostringstream oss;
  ostream oStack_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_1a8);
  format<Identifier,Identifier,unsigned_long>
            (&oStack_1a8,(char *)this,(Identifier *)fmt,args,(unsigned_long *)args_1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}